

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O0

void __thiscall
libguarded::
rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::
rcu_guard::rcu_read_lock
          (rcu_guard *this,
          rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
          *list)

{
  bool bVar1;
  pointer pzVar2;
  __pointer_type local_28;
  zombie_list_node *oldNext;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *local_18;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *list_local;
  rcu_guard *this_local;
  
  this->m_list = list;
  local_18 = list;
  list_local = (rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
                *)this;
  pzVar2 = std::
           allocator_traits<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::zombie_list_node>_>
           ::allocate((allocator_type *)&list->field_0x41,1);
  this->m_zombie = pzVar2;
  oldNext = (zombie_list_node *)this;
  std::
  allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::zombie_list_node>>
  ::
  construct<libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::zombie_list_node,libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::rcu_guard*>
            ((allocator_type *)&local_18->field_0x41,this->m_zombie,(rcu_guard **)&oldNext);
  local_28 = std::
             atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::zombie_list_node_*>
             ::load(&local_18->m_zombie_head,relaxed);
  do {
    std::
    atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::zombie_list_node_*>
    ::store(&this->m_zombie->next,local_28,relaxed);
    bVar1 = std::
            atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::zombie_list_node_*>
            ::compare_exchange_weak(&local_18->m_zombie_head,&local_28,this->m_zombie,seq_cst);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::rcu_guard::rcu_read_lock(const rcu_list<T, M, Alloc> &list)
{
   m_list   = &list;
   m_zombie = zombie_alloc_trait::allocate(list.m_zombie_alloc, 1);
   zombie_alloc_trait::construct(list.m_zombie_alloc, m_zombie, this);
   zombie_list_node *oldNext = list.m_zombie_head.load(std::memory_order_relaxed);

   do {
      m_zombie->next.store(oldNext, std::memory_order_relaxed);
   } while (!list.m_zombie_head.compare_exchange_weak(oldNext, m_zombie));
}